

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

void __thiscall TRM::Edge::Edge(Edge *this,Vertex *top,Vertex *bottom,int32_t winding)

{
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_00128cc8;
  this->top = top;
  this->bottom = bottom;
  this->above_prev = (Edge *)0x0;
  this->above_next = (Edge *)0x0;
  this->below_prev = (Edge *)0x0;
  this->below_next = (Edge *)0x0;
  this->left = (Edge *)0x0;
  this->right = (Edge *)0x0;
  this->right_poly_prev = (Edge *)0x0;
  this->right_poly_next = (Edge *)0x0;
  this->left_poly_prev = (Edge *)0x0;
  this->left_poly_next = (Edge *)0x0;
  this->left_poly = (Polygon *)0x0;
  this->right_poly = (Polygon *)0x0;
  this->used_in_left = false;
  this->used_in_right = false;
  this->winding = winding;
  this->le_a = (double)(bottom->point).field_1.y - (double)(top->point).field_1.y;
  this->le_b = (double)(top->point).field_0.x - (double)(bottom->point).field_0.x;
  this->le_c = (double)(bottom->point).field_0.x * (double)(top->point).field_1.y -
               (double)(bottom->point).field_1.y * (double)(top->point).field_0.x;
  return;
}

Assistant:

Edge::Edge(Vertex* top, Vertex* bottom, int32_t winding)
    : top(top),
      bottom(bottom),
      winding(winding),
      le_a(static_cast<double>(bottom->point.y) - top->point.y),
      le_b(static_cast<double>(top->point.x) - bottom->point.x),
      le_c(static_cast<double>(top->point.y) * bottom->point.x -
           static_cast<double>(top->point.x) * bottom->point.y) {}